

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnVector<signed_char>::ColumnVector(ColumnVector<signed_char> *this)

{
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffd8;
  Column *in_stack_ffffffffffffffe0;
  
  Type::CreateSimple<signed_char>();
  Column::Column(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x21333b);
  *in_RDI = &PTR__ColumnVector_002a02f8;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x213356);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}